

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O3

int encode_write(char *data,int len)

{
  int iVar1;
  uchar buf [128];
  char local_88;
  uchar local_87 [135];
  
  local_88 = '\t';
  iVar1 = encode((uchar *)data,len,local_87,0x7e);
  local_87[iVar1] = '\n';
  iVar1 = serial_write(&local_88,iVar1 + 2);
  if (iVar1 < 1) {
    iVar1 = -1;
  }
  else {
    tcflush(g_device_port,1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int encode_write(char* data, int len)
{
  unsigned char buf[128];
  int encode_len, ret;

  buf[0] = COMMUNICATION_START_BYTE;
  encode_len = encode((unsigned char*)data, len, buf + 1, 126);
  buf[encode_len + 1] = COMMUNICATION_END_BYTE;

  ret = serial_write((char*)buf, encode_len + 2);
  if (ret <= 0)
  {
    return -1;
  }
  serial_flush_out();

  return 0;
}